

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase1050::TestCase1050(TestCase1050 *this)

{
  TestCase1050 *this_local;
  
  TestCase::TestCase(&this->super_TestCase,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                     ,0x41a,"legacy test: Async/LargeTaskSetDestruction");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_00bf01c8;
  return;
}

Assistant:

TEST(Async, LargeTaskSetDestruction) {
  size_t stackSize = getSmallStackSize();

  runWithStackLimit(stackSize, [stackSize]() {
    ErrorHandlerImpl errorHandler;
    TaskSet tasks(errorHandler);

    for (int i = 0; i < stackSize / sizeof(void*); i++) {
      tasks.add(kj::NEVER_DONE);
    }
  });
}